

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_soa.cpp
# Opt level: O1

size_t embree::sse2::GridSOA::getBVHBytes(GridRange *range,size_t nodeBytes,size_t leafBytes)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  uint u_size_1;
  uint v_size_1;
  uint uVar9;
  uint u_size;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint v_size;
  uint uVar13;
  size_t sVar14;
  GridRange local_c0;
  uint local_b0 [32];
  
  local_c0.u_start = range->u_start;
  uVar5 = range->u_end;
  uVar4 = (uVar5 - local_c0.u_start) + 1;
  uVar1 = range->v_end;
  local_c0.v_start = range->v_start;
  uVar6 = (uVar1 - local_c0.v_start) + 1;
  sVar14 = leafBytes;
  if (3 < uVar4 || 3 < uVar6) {
    if (uVar4 < uVar6) {
      uVar4 = local_c0.v_start + uVar1 >> 1;
      uVar6 = uVar5;
      uVar9 = uVar4;
      uVar7 = local_c0.u_start;
    }
    else {
      uVar6 = local_c0.u_start + uVar5 >> 1;
      uVar4 = local_c0.v_start;
      uVar9 = uVar1;
      uVar7 = uVar6;
    }
    uVar10 = (uVar6 - local_c0.u_start) + 1;
    uVar13 = (uVar9 - local_c0.v_start) + 1;
    local_c0.u_end = uVar6;
    local_c0.v_end = uVar9;
    if ((uVar10 < 4) && (uVar13 < 4)) {
      iVar11 = 1;
    }
    else {
      if (uVar10 < uVar13) {
        local_b0[2] = uVar9 + local_c0.v_start >> 1;
        local_c0.v_end = local_b0[2];
        local_b0[0] = local_c0.u_start;
      }
      else {
        local_c0.u_end = uVar6 + local_c0.u_start >> 1;
        local_b0[0] = local_c0.u_end;
        local_b0[2] = local_c0.v_start;
      }
      iVar11 = 2;
      local_b0[1] = uVar6;
      local_b0[3] = uVar9;
    }
    uVar6 = (uVar5 - uVar7) + 1;
    uVar9 = (uVar1 - uVar4) + 1;
    uVar12 = (ulong)(uint)(iVar11 << 4);
    puVar8 = (uint *)((long)&local_c0.u_start + uVar12);
    if ((uVar6 < 4) && (uVar9 < 4)) {
      *puVar8 = uVar7;
      *(uint *)((long)local_b0 + (uVar12 - 0xc)) = uVar5;
      *(uint *)((long)local_b0 + (uVar12 - 8)) = uVar4;
      *(uint *)((long)local_b0 + (uVar12 - 4)) = uVar1;
      iVar2 = 1;
    }
    else {
      *puVar8 = uVar7;
      *(uint *)((long)local_b0 + (uVar12 - 0xc)) = uVar5;
      *(uint *)((long)local_b0 + (uVar12 - 8)) = uVar4;
      *(uint *)((long)local_b0 + (uVar12 - 4)) = uVar1;
      *(uint *)((long)local_b0 + uVar12) = uVar7;
      *(uint *)((long)local_b0 + uVar12 + 4) = uVar5;
      *(uint *)((long)local_b0 + uVar12 + 8) = uVar4;
      *(uint *)((long)local_b0 + uVar12 + 0xc) = uVar1;
      if (uVar6 < uVar9) {
        uVar5 = uVar4 + uVar1 >> 1;
        *(uint *)((long)local_b0 + (uVar12 - 4)) = uVar5;
        *(uint *)((long)local_b0 + uVar12 + 8) = uVar5;
      }
      else {
        uVar5 = uVar7 + uVar5 >> 1;
        *(uint *)((long)local_b0 + (uVar12 - 0xc)) = uVar5;
        *(uint *)((long)local_b0 + uVar12) = uVar5;
      }
      iVar2 = 2;
    }
    uVar12 = 0;
    sVar14 = nodeBytes;
    do {
      sVar3 = getBVHBytes((GridRange *)((long)&local_c0.u_start + uVar12),nodeBytes,leafBytes);
      sVar14 = sVar14 + sVar3;
      uVar12 = uVar12 + 0x10;
    } while ((uint)((iVar11 + iVar2) * 0x10) != uVar12);
  }
  return sVar14;
}

Assistant:

size_t GridSOA::getBVHBytes(const GridRange& range, const size_t nodeBytes, const size_t leafBytes)
    {
      if (range.hasLeafSize()) 
        return leafBytes;
      
      __aligned(64) GridRange r[4];
      const size_t children = range.splitIntoSubRanges(r);
      
      size_t bytes = nodeBytes;
      for (size_t i=0; i<children; i++)
        bytes += getBVHBytes(r[i],nodeBytes,leafBytes);
      return bytes;
    }